

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

void __thiscall soul::RenderingVenue::Pimpl::SessionImpl::unload(SessionImpl *this)

{
  anon_class_8_1_8991fb9c local_38;
  TaskFunction local_30;
  SessionImpl *local_10;
  SessionImpl *this_local;
  
  local_10 = this;
  (*(this->super_Session)._vptr_Session[0xc])();
  local_38.this = this;
  std::function<void(std::atomic<int>&)>::
  function<soul::RenderingVenue::Pimpl::SessionImpl::unload()::_lambda(std::atomic<int>&)_1_,void>
            ((function<void(std::atomic<int>&)> *)&local_30,&local_38);
  TaskThread::Queue::addTask(&this->taskQueue,&local_30);
  std::function<void_(std::atomic<int>_&)>::~function(&local_30);
  return;
}

Assistant:

void unload() override
        {
            stop();

            taskQueue.addTask ([this] (TaskThread::ShouldStopFlag&)
            {
                performer->unload();
                setState (SessionState::empty);
            });
        }